

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateStringLiteral(ExpressionEvalContext *ctx,ExprStringLiteral *expression)

{
  ExprStringLiteral *this;
  ExprBase *pEVar1;
  ExprStringLiteral *expression_local;
  ExpressionEvalContext *ctx_local;
  
  this = ExpressionContext::get<ExprStringLiteral>(ctx->ctx);
  ExprStringLiteral::ExprStringLiteral
            (this,(expression->super_ExprBase).source,(expression->super_ExprBase).type,
             expression->value,expression->length);
  pEVar1 = CheckType(&expression->super_ExprBase,&this->super_ExprBase);
  return pEVar1;
}

Assistant:

ExprBase* EvaluateStringLiteral(ExpressionEvalContext &ctx, ExprStringLiteral *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprStringLiteral>()) ExprStringLiteral(expression->source, expression->type, expression->value, expression->length));
}